

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::media_fragment::print(media_fragment *this)

{
  size_type sVar1;
  long lVar2;
  const_reference pvVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  media_fragment *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::size(&this->emsg_);
    if (sVar1 <= (ulong)(long)local_14) break;
    std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
              (&this->emsg_,(long)local_14);
    lVar2 = std::__cxx11::string::size();
    if ((lVar2 != 0) && ((this->e_msg_is_in_mdat_ & 1U) == 0)) {
      pvVar3 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
                         (&this->emsg_,(long)local_14);
      (*(pvVar3->super_full_box).super_box._vptr_box[1])();
    }
    local_14 = local_14 + 1;
  }
  box::print(&this->moof_box_);
  mfhd::print(&this->mfhd_);
  tfhd::print(&this->tfhd_);
  tfdt::print(&this->tfdt_);
  trun::print(&this->trun_);
  box::print(&this->mdat_box_);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::size(&this->emsg_);
    if (sVar1 <= (ulong)(long)local_18) break;
    std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
              (&this->emsg_,(long)local_18);
    lVar2 = std::__cxx11::string::size();
    if ((lVar2 != 0) && ((this->e_msg_is_in_mdat_ & 1U) != 0)) {
      pvVar3 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
                         (&this->emsg_,(long)local_18);
      (*(pvVar3->super_full_box).super_box._vptr_box[1])();
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void media_fragment::print() const
	{
		for(int i=0;i<emsg_.size();i++)
		    if (emsg_[i].scheme_id_uri_.size() && !this->e_msg_is_in_mdat_)
			   emsg_[i].print();

		moof_box_.print(); // moof box size
		mfhd_.print(); // moof box header
		tfhd_.print(); // track fragment header
		tfdt_.print(); // track fragment decode time
		trun_.print(); // trun box
		mdat_box_.print(); // mdat 

		for (int i = 0; i<emsg_.size(); i++)
		    if (emsg_[i].scheme_id_uri_.size() && this->e_msg_is_in_mdat_)
			    emsg_[i].print();
	}